

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvamemtiming.c
# Opt level: O1

int parse_cmd_line(int argc,char **argv,nvamemtiming_conf *conf)

{
  __time_t _Var1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  long lVar4;
  char **argv_00;
  ulong uVar5;
  char *pcVar6;
  int val;
  nvamemtiming_conf nStack_a0;
  timeval tStack_68;
  char **ppcStack_58;
  nvamemtiming_conf *pnStack_50;
  char *pcStack_48;
  code *pcStack_40;
  undefined8 uStack_38;
  
  conf->cnum = 0;
  conf->mmiotrace = false;
  conf->mode = MODE_AUTO;
  (conf->vbios).file = (char *)0x0;
  *(uint8_t *)&conf->field_4 = 0xff;
  *(uint8_t *)((long)&conf->field_4 + 1) = 0xff;
  pcVar6 = "hts:f:d:b:c:e:v:";
  lVar4 = (long)&uStack_38 + 4;
  uStack_38 = in_RAX;
switchD_0010407e_caseD_67:
  pcStack_40 = (code *)0x10406b;
  iVar3 = argc;
  iVar2 = getopt(argc,argv,"hts:f:d:b:c:e:v:");
  switch(iVar2) {
  case 0x62:
    if (conf->mode != MODE_AUTO) goto switchD_0010407e_caseD_68;
    conf->mode = MODE_BITFIELD;
    break;
  case 99:
    pcStack_40 = (code *)0x1040bf;
    __isoc99_sscanf(_optarg,"%d",lVar4);
    conf->cnum = uStack_38._4_4_;
    goto switchD_0010407e_caseD_67;
  case 100:
    if (conf->mode != MODE_AUTO) goto switchD_0010407e_caseD_68;
    conf->mode = MODE_DEEP;
    break;
  case 0x65:
    if ((conf->mode & ~MODE_MANUAL) != MODE_AUTO) goto switchD_0010407e_caseD_68;
    conf->mode = MODE_MANUAL;
    break;
  case 0x66:
    if (conf->mode == MODE_AUTO) goto LAB_0010410b;
    goto switchD_0010407e_caseD_68;
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x75:
    goto switchD_0010407e_caseD_67;
  case 0x68:
    goto switchD_0010407e_caseD_68;
  case 0x73:
    if (conf->mode != MODE_AUTO) goto switchD_0010407e_caseD_68;
    break;
  case 0x74:
    conf->mmiotrace = true;
    goto switchD_0010407e_caseD_67;
  case 0x76:
    if ((conf->mode & ~MODE_MANUAL) != MODE_AUTO) goto switchD_0010407e_caseD_68;
    conf->mode = MODE_MANUAL;
LAB_0010410b:
    pcStack_40 = (code *)0x104126;
    __isoc99_sscanf(_optarg,"%d",lVar4);
    (conf->field_4).manual.value = uStack_38._4_1_;
    goto switchD_0010407e_caseD_67;
  default:
    goto switchD_0010407e_default;
  }
  pcStack_40 = (code *)0x104159;
  __isoc99_sscanf(_optarg,"%d",lVar4);
  (conf->field_4).manual.index = uStack_38._4_1_;
  goto switchD_0010407e_caseD_67;
switchD_0010407e_default:
  if (iVar2 == -1) {
    if (conf->cnum < nva_cardsnum) {
      pcVar6 = &optind;
      if (_optind + 4 != argc) goto switchD_0010407e_caseD_68;
      lVar4 = (long)_optind;
      (conf->vbios).file = argv[lVar4];
      iVar3 = 0;
      pcStack_40 = (code *)0x1041bc;
      __isoc99_sscanf(argv[lVar4 + 1],"%hx",&(conf->vbios).timing_table_offset);
      lVar4 = (long)_optind;
      pcStack_40 = (code *)0x1041c9;
      iVar2 = atoi(argv[lVar4 + 2]);
      (conf->timing).entry = (uint8_t)iVar2;
      pcStack_40 = (code *)0x1041d7;
      iVar2 = atoi(argv[lVar4 + 3]);
      (conf->timing).perflvl = (uint8_t)iVar2;
    }
    else {
      if (nva_cardsnum == 0) {
        pcStack_40 = (code *)0x1041ff;
        parse_cmd_line_cold_2();
      }
      else {
        pcStack_40 = (code *)0x104206;
        parse_cmd_line_cold_1();
      }
      iVar3 = 1;
    }
    return iVar3;
  }
  goto switchD_0010407e_caseD_67;
switchD_0010407e_caseD_68:
  pcStack_40 = main;
  argv_00 = argv;
  usage(iVar3,argv);
  ppcStack_58 = argv;
  pnStack_50 = conf;
  pcStack_48 = pcVar6;
  pcStack_40 = (code *)(ulong)(uint)argc;
  signal(2,signal_handler);
  signal(0xb,signal_handler);
  iVar2 = nva_init();
  if (iVar2 == 0) {
    parse_cmd_line(iVar3,argv_00,&nStack_a0);
    iVar3 = vbios_read(nStack_a0.vbios.file,&nStack_a0.vbios.data,&nStack_a0.vbios.length);
    if (iVar3 == 1) {
      iVar3 = read_timings(&nStack_a0);
      if (iVar3 == 0) {
        iVar3 = 0;
        gettimeofday(&tStack_68,(__timezone_ptr_t)0x0);
        _Var1 = tStack_68.tv_sec;
        switch(nStack_a0.mode) {
        case MODE_AUTO:
          iVar3 = shallow_dump(&nStack_a0);
          break;
        case MODE_BITFIELD:
          iVar3 = bitfield_check(&nStack_a0);
          break;
        case MODE_MANUAL:
          iVar3 = manual_check(&nStack_a0);
          break;
        case MODE_DEEP:
          iVar3 = deep_dump(&nStack_a0);
        }
        gettimeofday(&tStack_68,(__timezone_ptr_t)0x0);
        uVar5 = tStack_68.tv_sec - _Var1;
        printf("The run tested %i configurations in %li:%li:%lis\n",(ulong)nStack_a0.counter,
               uVar5 / 0xe10,(uVar5 % 0xe10) / 0x3c,uVar5 % 0x3c);
        return iVar3;
      }
      main_cold_3();
      return iVar3;
    }
    main_cold_2();
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int parse_cmd_line(int argc, char **argv, struct nvamemtiming_conf *conf)
{
	int c, val;

	conf->cnum = 0;
	conf->mmiotrace = false;
	conf->mode = MODE_AUTO;
	conf->vbios.file = NULL;
	conf->range.start = -1;
	conf->range.end = -1;

	while ((c = getopt (argc, argv, "hts:f:d:b:c:e:v:")) != -1)
		switch (c) {
			case 'e':
				if (conf->mode != MODE_AUTO && conf->mode != MODE_MANUAL)
					usage(argc, argv);
				conf->mode = MODE_MANUAL;
				sscanf(optarg, "%d", &val);
				conf->manual.index = val;
				break;
			case 'v':
				if (conf->mode != MODE_AUTO && conf->mode != MODE_MANUAL)
					usage(argc, argv);
				conf->mode = MODE_MANUAL;
				sscanf(optarg, "%d", &val);
				conf->manual.value = val;
				break;
			case 'd':
				if (conf->mode != MODE_AUTO)
					usage(argc, argv);
				conf->mode = MODE_DEEP;
				sscanf(optarg, "%d", &val);
				conf->deep.entry = val;
				break;
			case 'b':
				if (conf->mode != MODE_AUTO)
					usage(argc, argv);
				conf->mode = MODE_BITFIELD;
				sscanf(optarg, "%d", &val);
				conf->bitfield.index = val;
				break;
			case 's':
				if (conf->mode != MODE_AUTO)
					usage(argc, argv);
				sscanf(optarg, "%d", &val);
				conf->range.start = val;
				break;
			case 'f':
				if (conf->mode != MODE_AUTO)
					usage(argc, argv);
				sscanf(optarg, "%d", &val);
				conf->range.end = val;
				break;
			case 'c':
				sscanf(optarg, "%d", &val);
				conf->cnum = val;
				break;
			case 't':
				conf->mmiotrace = true;
				break;
			case 'h':
				usage(argc, argv);
		}
	if (conf->cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	if (argc != optind + 4)
		usage(argc, argv);

	conf->vbios.file = argv[optind];
	sscanf(argv[optind + 1], "%hx", &conf->vbios.timing_table_offset);
	conf->timing.entry = atoi(argv[optind + 2]);
	conf->timing.perflvl = atoi(argv[optind + 3]);

	return 0;
}